

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_do_movi
               (TCGContext_conflict9 *s,TCGTemp *ots,tcg_target_ulong val,TCGLifeData arg_life,
               TCGRegSet preferred_regs)

{
  TCGRegSet preferred_regs_local;
  TCGLifeData arg_life_local;
  tcg_target_ulong val_local;
  TCGTemp *ots_local;
  TCGContext_conflict9 *s_local;
  
  if (((uint)((ulong)*(undefined8 *)ots >> 8) & 0xff) == 1) {
    s->reg_to_temp[(uint)*(undefined8 *)ots & 0xff] = (TCGTemp *)0x0;
  }
  *(ulong *)ots = *(ulong *)ots & 0xffffffffffff00ff | 0x300;
  ots->val = val;
  *(ulong *)ots = *(ulong *)ots & 0xfffffff7ffffffff;
  if ((arg_life & 1) == 0) {
    if ((arg_life & 4) != 0) {
      temp_dead(s,ots);
    }
  }
  else {
    temp_sync(s,ots,s->reserved_regs,preferred_regs,arg_life & 4);
  }
  return;
}

Assistant:

static void tcg_reg_alloc_do_movi(TCGContext *s, TCGTemp *ots,
                                  tcg_target_ulong val, TCGLifeData arg_life,
                                  TCGRegSet preferred_regs)
{
    /* ENV should not be modified.  */
    tcg_debug_assert(!ots->fixed_reg);

    /* The movi is not explicitly generated here.  */
    if (ots->val_type == TEMP_VAL_REG) {
        s->reg_to_temp[ots->reg] = NULL;
    }
    ots->val_type = TEMP_VAL_CONST;
    ots->val = val;
    ots->mem_coherent = 0;
    if (NEED_SYNC_ARG(0)) {
        temp_sync(s, ots, s->reserved_regs, preferred_regs, IS_DEAD_ARG(0));
    } else if (IS_DEAD_ARG(0)) {
        temp_dead(s, ots);
    }
}